

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O1

void wallet::SetOptionsInputWeights(UniValue *inputs,UniValue *options)

{
  pointer pUVar1;
  pointer pcVar2;
  string key;
  UniValue val;
  UniValue val_00;
  undefined8 uVar3;
  pointer pbVar4;
  pointer pbVar5;
  pointer pbVar6;
  pointer pUVar7;
  bool bVar8;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar9;
  UniValue *__return_storage_ptr__;
  pointer pUVar10;
  long in_FS_OFFSET;
  size_t i_1;
  size_t i;
  UniValue weights;
  undefined8 in_stack_fffffffffffffe48;
  size_t in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined8 in_stack_fffffffffffffe68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  undefined8 in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  undefined8 uVar12;
  undefined8 in_stack_fffffffffffffe80;
  pointer in_stack_fffffffffffffe88;
  pointer in_stack_fffffffffffffe90;
  pointer in_stack_fffffffffffffe98;
  pointer pUVar13;
  undefined1 local_138 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  pointer local_110 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  vector<UniValue,_std::allocator<UniValue>_> local_e8;
  string local_d0;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [9];
  undefined4 local_97;
  undefined2 local_93;
  char local_91;
  undefined1 local_90 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<UniValue,_std::allocator<UniValue>_> vStack_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = local_90 + 0x10;
  local_90._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"input_weights","");
  bVar8 = ::UniValue::findKey(options,(string *)local_90,(size_t *)&local_d0);
  if ((pointer)local_90._0_8_ != pcVar2) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  if (bVar8) {
    __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
    local_90._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,
               "Input weights should be specified in inputs rather than in options.","");
    JSONRPCError(__return_storage_ptr__,-8,(string *)local_90);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(__return_storage_ptr__,&::UniValue::typeinfo,::UniValue::~UniValue);
    }
  }
  else {
    if ((inputs->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (inputs->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_b0 = local_a0;
      local_a8 = 0;
      local_90._8_8_ = &local_78;
      local_90._0_4_ = 2;
      local_78._M_local_buf[0] = '\0';
      local_78._1_7_ = (undefined7)local_a0._1_8_;
      local_78._M_local_buf[8] = SUB81(local_a0._1_8_,7);
      local_78._9_4_ = local_97;
      local_78._13_2_ = local_93;
      local_78._M_local_buf[0xf] = local_91;
      local_90._16_8_ = 0;
      local_a0[0] = 0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pvVar9 = ::UniValue::getValues(inputs);
      pUVar10 = (pvVar9->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pUVar1 = (pvVar9->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pUVar10 != pUVar1) {
        do {
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"weight","");
          bVar8 = ::UniValue::findKey(pUVar10,&local_d0,(size_t *)&stack0xfffffffffffffe58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if (bVar8) {
            local_138._16_4_ = pUVar10->typ;
            local_120._M_allocated_capacity = (size_type)(local_138 + 0x28);
            pcVar2 = (pUVar10->val)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(local_138 + 0x18),pcVar2,pcVar2 + (pUVar10->val)._M_string_length)
            ;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_138 + 0x38),&pUVar10->keys);
            std::vector<UniValue,_std::allocator<UniValue>_>::vector
                      ((vector<UniValue,_std::allocator<UniValue>_> *)(local_138 + 0x50),
                       &pUVar10->values);
            val.val._M_dataplus._M_p = (pointer)options;
            val._0_8_ = in_stack_fffffffffffffe48;
            val.val._M_string_length = in_stack_fffffffffffffe58;
            val.val.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffe60;
            val.val.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffe64;
            val.val.field_2._8_8_ = in_stack_fffffffffffffe68;
            val.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe70;
            val.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe78;
            val.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffe80;
            val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe88;
            val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe90;
            val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffe98;
            ::UniValue::push_back((UniValue *)local_90,val);
            std::vector<UniValue,_std::allocator<UniValue>_>::~vector
                      ((vector<UniValue,_std::allocator<UniValue>_> *)(local_138 + 0x50));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_138 + 0x38));
            if ((undefined1 *)local_120._M_allocated_capacity != local_138 + 0x28) {
              operator_delete((void *)local_120._M_allocated_capacity,
                              (ulong)((long)&(local_110[0]->_M_dataplus)._M_p + 1));
            }
          }
          pUVar10 = pUVar10 + 1;
        } while (pUVar10 != pUVar1);
      }
      pUVar13 = (pointer)local_138;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffeb8,"input_weights","");
      pUVar7 = vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pUVar1 = vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pUVar10 = vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start;
      pbVar6 = local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pbVar5 = local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar4 = local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = local_90._16_8_;
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._8_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._8_8_ == &local_78) {
        in_stack_fffffffffffffe80 =
             CONCAT17(local_78._M_local_buf[0xf],
                      CONCAT25(local_78._13_2_,CONCAT41(local_78._9_4_,local_78._M_local_buf[8])));
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&stack0xfffffffffffffe78;
      }
      uVar12._1_7_ = local_78._1_7_;
      uVar12._0_1_ = local_78._M_local_buf[0];
      local_90._16_8_ = 0;
      local_78._M_local_buf[0] = '\0';
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      key._M_string_length = (size_type)options;
      key._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe48;
      key.field_2._M_allocated_capacity = in_stack_fffffffffffffe58;
      key.field_2._8_4_ = local_90._0_4_;
      key.field_2._12_4_ = in_stack_fffffffffffffe64;
      val_00.val._M_dataplus._M_p = (pointer)uVar3;
      val_00._0_8_ = paVar11;
      val_00.val._M_string_length = uVar12;
      val_00.val.field_2._M_allocated_capacity = in_stack_fffffffffffffe80;
      val_00.val.field_2._8_8_ = pbVar4;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pbVar5;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar6;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pUVar10;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = pUVar1;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = pUVar7;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pUVar13;
      local_90._8_8_ = &local_78;
      ::UniValue::pushKV(options,key,val_00);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector
                ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffffea0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xfffffffffffffe88);
      if (paVar11 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&stack0xfffffffffffffe78) {
        operator_delete(paVar11,uVar12 + 1);
      }
      if (pUVar13 != (pointer)local_138) {
        operator_delete(pUVar13,local_138._0_8_ + 1);
      }
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_50);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._8_8_ != &local_78) {
        operator_delete((void *)local_90._8_8_,CONCAT71(local_78._1_7_,local_78._M_local_buf[0]) + 1
                       );
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

static void SetOptionsInputWeights(const UniValue& inputs, UniValue& options)
{
    if (options.exists("input_weights")) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Input weights should be specified in inputs rather than in options.");
    }
    if (inputs.size() == 0) {
        return;
    }
    UniValue weights(UniValue::VARR);
    for (const UniValue& input : inputs.getValues()) {
        if (input.exists("weight")) {
            weights.push_back(input);
        }
    }
    options.pushKV("input_weights", std::move(weights));
}